

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::(anonymous_namespace)::createTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int threads,
          int perThreadContextCount)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream stream;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = (ostream *)std::ostream::operator<<(aoStack_198,(int)this);
  pcVar2 = "_threads_";
  if ((int)this == 1) {
    pcVar2 = "_thread_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,threads);
  pcVar2 = "_contexts";
  if (threads == 1) {
    pcVar2 = "_context";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

string createTestName(int threads, int perThreadContextCount)
{
	std::ostringstream stream;

	stream << threads << (threads == 1 ? "_thread_" : "_threads_") << perThreadContextCount << (perThreadContextCount == 1 ? "_context" : "_contexts");

	return stream.str();
}